

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O2

AssertionResult __thiscall
testing::(anonymous_namespace)::IsSubstringImpl<char_const*>
          (_anonymous_namespace_ *this,bool expected_to_be_substring,char *needle_expr,
          char *haystack_expr,char **needle,char **haystack)

{
  char *__haystack;
  char *pcVar1;
  Message *pMVar2;
  String *extraout_RDX;
  String *extraout_RDX_00;
  bool bVar3;
  AssertionResult AVar4;
  char *begin_string_quote;
  Message local_50;
  char *local_48;
  char *local_40;
  char *local_38;
  char *local_30;
  
  pcVar1 = *needle;
  __haystack = *haystack;
  local_40 = haystack_expr;
  local_38 = needle_expr;
  if (pcVar1 == (char *)0x0 || __haystack == (char *)0x0) {
    bVar3 = pcVar1 == __haystack;
  }
  else {
    pcVar1 = strstr(__haystack,pcVar1);
    bVar3 = pcVar1 != (char *)0x0;
    needle_expr = (char *)extraout_RDX;
  }
  if (bVar3 == expected_to_be_substring) {
    *this = (_anonymous_namespace_)0x1;
    *(undefined8 *)(this + 8) = 0;
  }
  else {
    local_48 = "\"";
    Message::Message(&local_50);
    pMVar2 = Message::operator<<(&local_50,(char (*) [11])"Value of: ");
    pMVar2 = Message::operator<<(pMVar2,&local_38);
    pMVar2 = Message::operator<<(pMVar2,(char (*) [2])0x170285);
    pMVar2 = Message::operator<<(pMVar2,(char (*) [11])0x16fbcd);
    pMVar2 = Message::operator<<(pMVar2,&local_48);
    pMVar2 = Message::operator<<(pMVar2,needle);
    pMVar2 = Message::operator<<(pMVar2,(char (*) [3])0x170343);
    pMVar2 = Message::operator<<(pMVar2,(char (*) [11])0x16fbd9);
    local_30 = "not ";
    if (expected_to_be_substring) {
      local_30 = "";
    }
    pMVar2 = Message::operator<<(pMVar2,&local_30);
    pMVar2 = Message::operator<<(pMVar2,(char (*) [16])"a substring of ");
    pMVar2 = Message::operator<<(pMVar2,&local_40);
    pMVar2 = Message::operator<<(pMVar2,(char (*) [2])0x170285);
    pMVar2 = Message::operator<<(pMVar2,(char (*) [11])0x16fbf6);
    pMVar2 = Message::operator<<(pMVar2,&local_48);
    pMVar2 = Message::operator<<(pMVar2,haystack);
    pMVar2 = Message::operator<<(pMVar2,(char (*) [2])0x16fcb2);
    AVar4 = AssertionFailure((testing *)this,pMVar2);
    needle_expr = (char *)AVar4.message_.ptr_;
    if (local_50.ss_ != (StrStream *)0x0) {
      (**(code **)(*(long *)local_50.ss_ + 8))();
      needle_expr = (char *)extraout_RDX_00;
    }
  }
  AVar4.message_.ptr_ = (String *)needle_expr;
  AVar4._0_8_ = this;
  return AVar4;
}

Assistant:

AssertionResult IsSubstringImpl(
    bool expected_to_be_substring,
    const char* needle_expr, const char* haystack_expr,
    const StringType& needle, const StringType& haystack) {
  if (IsSubstringPred(needle, haystack) == expected_to_be_substring)
    return AssertionSuccess();

  const bool is_wide_string = sizeof(needle[0]) > 1;
  const char* const begin_string_quote = is_wide_string ? "L\"" : "\"";
  return AssertionFailure(
      Message()
      << "Value of: " << needle_expr << "\n"
      << "  Actual: " << begin_string_quote << needle << "\"\n"
      << "Expected: " << (expected_to_be_substring ? "" : "not ")
      << "a substring of " << haystack_expr << "\n"
      << "Which is: " << begin_string_quote << haystack << "\"");
}